

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_indirect_string.cpp
# Opt level: O2

void __thiscall
IndirectStringAdder_NothingAdded_Test::IndirectStringAdder_NothingAdded_Test
          (IndirectStringAdder_NothingAdded_Test *this)

{
  anon_unknown.dwarf_1f9e83::IndirectStringAdder::IndirectStringAdder
            (&this->super_IndirectStringAdder);
  (this->super_IndirectStringAdder).super_Test._vptr_Test =
       (_func_int **)&PTR__IndirectStringAdder_00258a30;
  return;
}

Assistant:

TEST_F (IndirectStringAdder, NothingAdded) {
    mock_mutex mutex;
    auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
    auto const name_index = pstore::index::get_index<pstore::trailer::indices::name> (db_);

    pstore::indirect_string_adder adder;
    adder.flush (transaction);
    EXPECT_EQ (transaction.size (), 0U);
    transaction.commit ();
}